

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseCWL.cpp
# Opt level: O3

void extractLikeEnv(Classification *result,string *c,size_t *i)

{
  long *local_40 [2];
  long local_30 [2];
  
  std::__cxx11::string::substr((ulong)local_40,(ulong)c);
  std::__cxx11::string::operator=((string *)&result->behavesLike,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  *i = c->_M_string_length;
  return;
}

Assistant:

void extractLikeEnv (Classification &result, string &c, size_t &i) {
    result.behavesLike = c.substr(i, c.size() - i);
    i = c.size();
}